

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O3

boolean readentry(char *line,toptenentry *tt)

{
  int iVar1;
  
  iVar1 = __isoc99_sscanf(line,
                          "%d.%d.%d %d %d %d %d %d %d %d %d %d %d %d %d %3s %3s %3s %3s %15[^,],%99[^\n]%*c"
                          ,&tt->ver_major,&tt->ver_minor,&tt->patchlevel,tt,&tt->deathdnum,
                          &tt->deathlev,&tt->maxlvl,&tt->hp,&tt->maxhp,&tt->deaths,&tt->deathdate,
                          &tt->birthdate,&tt->uid,&tt->moves,&tt->how,tt->plrole,tt->plrace,
                          tt->plgend,tt->plalign,tt->name,tt->death);
  return iVar1 == 0x15;
}

Assistant:

static boolean readentry(char *line, struct toptenentry *tt)
{
    /* 
     * "3.4.3 77 0 1 1 0 15 1 20110727 20110727 1000 Bar Orc Mal Cha daniel,killed by a newt"
     */
    static const char fmt[] = "%d.%d.%d %d %d %d %d %d %d %d %d"
                              " %d %d %d %d %3s %3s %3s %3s %15[^,],%99[^\n]%*c";
    int rv;
    
    rv = sscanf(line, fmt, &tt->ver_major, &tt->ver_minor, &tt->patchlevel,
		&tt->points, &tt->deathdnum, &tt->deathlev, &tt->maxlvl,
		&tt->hp, &tt->maxhp, &tt->deaths, &tt->deathdate,
		&tt->birthdate, &tt->uid, &tt->moves, &tt->how, tt->plrole,
		tt->plrace, tt->plgend, tt->plalign, tt->name, tt->death);
    
    return rv == 21;
}